

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeHFE.cpp
# Opt level: O0

int __thiscall
FormatTypeHFE::LoadDisk
          (FormatTypeHFE *this,uchar *buffer,size_t size,IDisk **created_disk,
          ILoadingProgress *loading_progress)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  IDisk *this_00;
  ulong uVar3;
  MFMTrack *pMVar4;
  void *__dest;
  void *pvVar5;
  void *pvVar6;
  uchar *puVar7;
  void *local_2c0;
  uint local_2b4;
  uint local_2a8;
  int local_2a4;
  uint i;
  int side_1;
  uint cnt;
  int index;
  uchar buf [512];
  uint local_90;
  int local_8c;
  int byte_to_read;
  int track;
  uchar *buffer2;
  uchar *buffer1;
  Pictrack *pck_trk;
  int side;
  Picfileformatheader header;
  int index_buffer;
  IDisk *new_disk;
  ILoadingProgress *loading_progress_local;
  IDisk **created_disk_local;
  size_t size_local;
  uchar *buffer_local;
  FormatTypeHFE *this_local;
  
  if (*(long *)buffer == 0x4546434950435848) {
    this_00 = (IDisk *)operator_new(0x68);
    IDisk::IDisk(this_00);
    uVar1 = *(undefined8 *)(buffer + 8);
    header.header_signature[2] = (uchar)((ulong)uVar1 >> 0x10);
    this_00->nb_sides_ = header.header_signature[2];
    for (pck_trk._0_4_ = 0; header.header_signature[1] = (uchar)((ulong)uVar1 >> 8),
        (int)pck_trk < (int)(uint)this_00->nb_sides_; pck_trk._0_4_ = (int)pck_trk + 1) {
      this_00->side_[(int)pck_trk].nb_tracks = (uint)header.header_signature[1];
      auVar2 = ZEXT416(this_00->side_[(int)pck_trk].nb_tracks) * ZEXT816(0x20);
      uVar3 = auVar2._0_8_;
      if (auVar2._8_8_ != 0) {
        uVar3 = 0xffffffffffffffff;
      }
      pMVar4 = (MFMTrack *)operator_new__(uVar3);
      this_00->side_[(int)pck_trk].tracks = pMVar4;
      memset(this_00->side_[(int)pck_trk].tracks,0,
             (ulong)this_00->side_[(int)pck_trk].nb_tracks << 5);
    }
    uVar3 = SUB168(ZEXT116(header.header_signature[1]) * ZEXT816(4),0);
    if (SUB168(ZEXT116(header.header_signature[1]) * ZEXT816(4),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    __dest = operator_new__(uVar3);
    memcpy(__dest,buffer + 0x200,(ulong)header.header_signature[1] << 2);
    for (local_8c = 0; local_8c < (int)(uint)header.header_signature[1]; local_8c = local_8c + 1) {
      header._18_4_ = (uint)*(ushort *)((long)__dest + (long)local_8c * 4) << 9;
      pvVar5 = operator_new__((long)(int)(*(ushort *)((long)__dest + (long)local_8c * 4 + 2) / 2));
      pvVar6 = operator_new__((long)(int)(*(ushort *)((long)__dest + (long)local_8c * 4 + 2) / 2));
      side_1 = 0;
      for (local_90 = *(ushort *)((long)__dest + (long)local_8c * 4 + 2) / 2; 0 < (int)local_90;
          local_90 = local_90 - local_2b4) {
        memcpy(&cnt,buffer + (int)header._18_4_,0x200);
        header._18_4_ = header._18_4_ + 0x200;
        if ((int)local_90 < 0x100) {
          local_2b4 = local_90;
        }
        else {
          local_2b4 = 0x100;
        }
        memcpy((void *)((long)pvVar5 + (long)side_1),&cnt,(ulong)local_2b4);
        memcpy((void *)((long)pvVar6 + (long)side_1),buf + 0xf8,(ulong)local_2b4);
        side_1 = local_2b4 + side_1;
      }
      for (local_2a4 = 0; local_2a4 < (int)(uint)this_00->nb_sides_; local_2a4 = local_2a4 + 1) {
        this_00->side_[local_2a4].tracks[local_8c].size =
             (uint)*(ushort *)((long)__dest + (long)local_8c * 4 + 2) << 2;
        puVar7 = (uchar *)operator_new__((ulong)this_00->side_[local_2a4].tracks[local_8c].size);
        this_00->side_[local_2a4].tracks[local_8c].bitfield = puVar7;
        for (local_2a8 = 0; local_2a8 < this_00->side_[local_2a4].tracks[local_8c].size;
            local_2a8 = local_2a8 + 1) {
          local_2c0 = pvVar6;
          if (local_2a4 == 0) {
            local_2c0 = pvVar5;
          }
          this_00->side_[local_2a4].tracks[local_8c].bitfield[local_2a8] =
               (byte)((int)(uint)*(byte *)((long)local_2c0 + (ulong)(local_2a8 >> 3)) >>
                     ((byte)local_2a8 & 7)) & 1;
        }
      }
      if (pvVar5 != (void *)0x0) {
        operator_delete__(pvVar5);
      }
      if (pvVar6 != (void *)0x0) {
        operator_delete__(pvVar6);
      }
    }
    if (__dest != (void *)0x0) {
      operator_delete__(__dest);
    }
    *created_disk = this_00;
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int FormatTypeHFE::LoadDisk(const unsigned char* buffer, size_t size, IDisk*& created_disk,
                            ILoadingProgress* loading_progress)
{
   if (memcmp(buffer, "HXCPICFE", 8) == 0)
   {
      IDisk* new_disk = new IDisk();

      // Header
      int index_buffer = 0;

      Picfileformatheader header;
      //fread(&header, 1, sizeof(header), file);
      memcpy(&header, buffer, sizeof(header));
      index_buffer += sizeof(header);

      // Number of sides
      new_disk->nb_sides_ = header.number_of_side;

      for (int side = 0; side < new_disk->nb_sides_; side++)
      {
         new_disk->side_[side].nb_tracks = header.number_of_track;
         new_disk->side_[side].tracks = new IDisk::MFMTrack[new_disk->side_[side].nb_tracks];
         memset(new_disk->side_[side].tracks, 0, sizeof(IDisk::MFMTrack) * new_disk->side_[side].nb_tracks);
      }

      //fseek(file, 0x200, SEEK_SET);
      index_buffer = 0x200;

      Pictrack* pck_trk = new Pictrack[header.number_of_track];
      //fread(pck_trk, 1, sizeof(pck_trk) * header.number_of_track, file);
      memcpy(pck_trk, &buffer[index_buffer], sizeof(Pictrack) * header.number_of_track);
      index_buffer += sizeof(pck_trk) * header.number_of_track;

      // Second part : (up to 1024 bytes) : Track offset LUT
      unsigned char* buffer1;
      unsigned char* buffer2;
      for (int track = 0; track < header.number_of_track; track++)
      {
         // Track data
         //fseek(file, 0x200 * pck_trk[track].offset, SEEK_SET);
         index_buffer = 0x200 * pck_trk[track].offset;

         // Read bytes
         buffer1 = new unsigned char[pck_trk[track].track_len / 2];
         buffer2 = new unsigned char[pck_trk[track].track_len / 2];

         int byte_to_read = pck_trk[track].track_len / 2;
         unsigned char buf[0x200];
         int index = 0;
         while (byte_to_read > 0)
         {
            //fread(buf, 1, 0x200, file);
            memcpy(buf, &buffer[index_buffer], 0x200);
            index_buffer += 0x200;

            unsigned int cnt = (byte_to_read < 0x100) ? byte_to_read : 0x100;

            memcpy(&buffer1[index], buf, cnt);
            memcpy(&buffer2[index], &buf[0x100], cnt);

            byte_to_read -= cnt;
            index += cnt;
         }


         for (int side = 0; side < new_disk->nb_sides_; side++)
         {
            new_disk->side_[side].tracks[track].size = pck_trk[track].track_len * 4;
            new_disk->side_[side].tracks[track].bitfield = new unsigned char[new_disk->side_[side].
               tracks[track].size];

            // TODO : Multiple side
            for (unsigned int i = 0; i < new_disk->side_[side].tracks[track].size; i++)
            {
               new_disk->side_[side].tracks[track].bitfield[i] = (((side == 0) ? buffer1 : buffer2)[
                  i >> 3]) >> ((i & 7)) & 1;
            }
         }
         delete[]buffer1;
         delete[]buffer2;
      }

      delete[]pck_trk;

      created_disk = new_disk;
      return OK;
   }
   else
   {
      return FILE_ERROR;
   }
}